

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

void __thiscall
wabt::intrusive_list<wabt::ModuleField>::push_back
          (intrusive_list<wabt::ModuleField> *this,
          unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *node)

{
  pointer pMVar1;
  bool bVar2;
  ModuleField *node_p;
  unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *node_local;
  intrusive_list<wabt::ModuleField> *this_local;
  
  pMVar1 = std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::operator->
                     (node);
  bVar2 = false;
  if (*(long *)(pMVar1 + 0x10) == 0) {
    pMVar1 = std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::operator->
                       (node);
    bVar2 = *(long *)(pMVar1 + 8) == 0;
  }
  if (!bVar2) {
    __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                  ,0x1bf,
                  "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
                 );
  }
  pMVar1 = std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::release
                     (node);
  if (*(long *)(this + 8) == 0) {
    *(pointer *)this = pMVar1;
  }
  else {
    *(undefined8 *)(pMVar1 + 0x10) = *(undefined8 *)(this + 8);
    *(pointer *)(*(long *)(this + 8) + 8) = pMVar1;
  }
  *(pointer *)(this + 8) = pMVar1;
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  return;
}

Assistant:

inline void intrusive_list<T>::push_back(std::unique_ptr<T> node) {
  assert(node->prev_ == nullptr && node->next_ == nullptr);

  T* node_p = node.release();
  if (last_) {
    node_p->prev_ = last_;
    last_->next_ = node_p;
  } else {
    first_ = node_p;
  }
  last_ = node_p;
  size_++;
}